

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedGroundCombatVehicle.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_EnhancedGroundCombatVehicle::Encode
          (GED_EnhancedGroundCombatVehicle *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  GED_EnhancedGroundCombatVehicle *this_local;
  
  GED_BasicGroundCombatVehicle::Encode(&this->super_GED_BasicGroundCombatVehicle,stream);
  pKVar1 = KDataStream::operator<<(stream,this->m_ui8FuelStatus);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8GrndMaintStatus);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8PriAmmun);
  KDataStream::operator<<(pKVar1,this->m_ui8SecAmmun);
  return;
}

Assistant:

void GED_EnhancedGroundCombatVehicle::Encode( KDataStream & stream ) const
{
    GED_BasicGroundCombatVehicle::Encode( stream );

    stream << m_ui8FuelStatus
           << m_ui8GrndMaintStatus
           << m_ui8PriAmmun
           << m_ui8SecAmmun;
}